

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tiny_gltf.h
# Opt level: O2

void __thiscall tinygltf::Sampler::Sampler(Sampler *this,Sampler *param_1)

{
  int iVar1;
  int iVar2;
  int iVar3;
  
  std::__cxx11::string::string((string *)this,(string *)param_1);
  iVar1 = param_1->magFilter;
  iVar2 = param_1->wrapS;
  iVar3 = param_1->wrapT;
  this->minFilter = param_1->minFilter;
  this->magFilter = iVar1;
  this->wrapS = iVar2;
  this->wrapT = iVar3;
  Value::Value(&this->extras,&param_1->extras);
  std::_Rb_tree_header::_Rb_tree_header
            (&(this->extensions)._M_t._M_impl.super__Rb_tree_header,
             &(param_1->extensions)._M_t._M_impl.super__Rb_tree_header);
  std::__cxx11::string::string
            ((string *)&this->extras_json_string,(string *)&param_1->extras_json_string);
  std::__cxx11::string::string
            ((string *)&this->extensions_json_string,(string *)&param_1->extensions_json_string);
  return;
}

Assistant:

Sampler() = default;